

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O3

int checkConstant(double *x,int N)

{
  double *pdVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 2;
  if (2 < N) {
    iVar3 = N;
  }
  uVar4 = 1;
  do {
    if (iVar3 - 1 == uVar4) {
      return 1;
    }
    lVar2 = uVar4 + 1;
    pdVar1 = x + uVar4;
    uVar4 = uVar4 + 1;
  } while (x[lVar2] == *pdVar1);
  return 0;
}

Assistant:

int checkConstant(double *x, int N) {
    int i, cc;
    double diff;
    cc = 0;

    /// heap buffer overflow fix, since accessing x[i+1] need to 
    /// stop loop at -1 index from end of array as dictated by length defined by N
    for(i = 1; i < N - 1;++i) {
        diff = x[i+1] - x[i];
        if (fabs(diff) > 0) {
            return cc;
        }
    }

    cc = 1;

    return cc;
}